

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

bool __thiscall luna::Table::EraseArrayValue(Table *this,size_t index)

{
  Table *pTVar1;
  iterator __i;
  pointer __i_00;
  Table *in_RSI;
  iterator it;
  vector<luna::Value,_std::allocator<luna::Value>_> *in_stack_ffffffffffffffb8;
  vector<luna::Value,_std::allocator<luna::Value>_> *in_stack_ffffffffffffffd0;
  const_iterator in_stack_ffffffffffffffd8;
  
  if ((in_RSI != (Table *)0x0) && (pTVar1 = (Table *)ArraySize(in_RSI), in_RSI <= pTVar1)) {
    std::
    unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
    ::operator->((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                  *)0x1395f6);
    __i = std::vector<luna::Value,_std::allocator<luna::Value>_>::begin(in_stack_ffffffffffffffb8);
    std::
    advance<__gnu_cxx::__normal_iterator<luna::Value*,std::vector<luna::Value,std::allocator<luna::Value>>>,unsigned_long>
              ((__normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
                *)__i._M_current,(unsigned_long)in_stack_ffffffffffffffd8._M_current);
    __i_00 = std::
             unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
             ::operator->((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                           *)0x139624);
    __gnu_cxx::
    __normal_iterator<luna::Value_const*,std::vector<luna::Value,std::allocator<luna::Value>>>::
    __normal_iterator<luna::Value*>
              ((__normal_iterator<const_luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
                *)in_RSI,
               (__normal_iterator<luna::Value_*,_std::vector<luna::Value,_std::allocator<luna::Value>_>_>
                *)__i_00);
    std::vector<luna::Value,_std::allocator<luna::Value>_>::erase
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
    return true;
  }
  return false;
}

Assistant:

bool Table::EraseArrayValue(std::size_t index)
    {
        if (index < 1 || index > ArraySize())
            return false;

        auto it = array_->begin();
        std::advance(it, index - 1);
        array_->erase(it);
        return true;
    }